

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefVectorOf<xercesc_4_0::XMLNumber> **objToLoad,int initSize,bool toAdopt,
               NumberType numType,XSerializeEngine *serEng)

{
  bool bVar1;
  MemoryManager *pMVar2;
  RefVectorOf<xercesc_4_0::XMLNumber> *this;
  XMLNumber *toAdd;
  XSerializeEngine *extraout_RDX;
  XSerializeEngine *serEng_00;
  XSerializeEngine *extraout_RDX_00;
  XMLSize_t maxElems;
  XMLSize_t i;
  ulong uVar3;
  XMLSize_t vectorLength;
  
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    this = *objToLoad;
    if (this == (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0) {
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      this = (RefVectorOf<xercesc_4_0::XMLNumber> *)XMemory::operator_new(0x30,pMVar2);
      pMVar2 = XSerializeEngine::getMemoryManager(serEng);
      maxElems = 0x10;
      if (-1 < initSize) {
        maxElems = (XMLSize_t)(uint)initSize;
      }
      RefVectorOf<xercesc_4_0::XMLNumber>::RefVectorOf(this,maxElems,toAdopt,pMVar2);
      *objToLoad = this;
    }
    XSerializeEngine::registerObject(serEng,this);
    vectorLength = 0;
    XSerializeEngine::readSize(serEng,&vectorLength);
    serEng_00 = extraout_RDX;
    for (uVar3 = 0; uVar3 < vectorLength; uVar3 = uVar3 + 1) {
      toAdd = XMLNumber::loadNumber((XMLNumber *)(ulong)numType,(NumberType)serEng,serEng_00);
      BaseRefVectorOf<xercesc_4_0::XMLNumber>::addElement
                (&(*objToLoad)->super_BaseRefVectorOf<xercesc_4_0::XMLNumber>,toAdd);
      serEng_00 = extraout_RDX_00;
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefVectorOf<XMLNumber>** objToLoad
                                   , int                       initSize
                                   , bool                      toAdopt
                                   , XMLNumber::NumberType     numType
                                   , XSerializeEngine&         serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {
        if (!*objToLoad)
        {
            if (initSize < 0)
                initSize = 16;

            *objToLoad = new (serEng.getMemoryManager())
                             RefVectorOf<XMLNumber>(
                                                    initSize
                                                  , toAdopt
                                                  , serEng.getMemoryManager()
                                                   );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t vectorLength = 0;
        serEng.readSize (vectorLength);
        for (XMLSize_t i = 0 ; i < vectorLength; i++)
        {
            XMLNumber*  data;
            data = XMLNumber::loadNumber(numType , serEng);
            (*objToLoad)->addElement(data);
        }
    }

}